

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.h
# Opt level: O0

szind_t sz_size2index_compute(size_t size)

{
  uint uVar1;
  size_t x_00;
  ulong in_RDI;
  szind_t index;
  szind_t mod;
  size_t delta_inverse_mask;
  szind_t lg_delta;
  szind_t grp;
  szind_t shift;
  szind_t x;
  szind_t lg_ceil;
  szind_t lg_tmin;
  undefined1 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (in_RDI < 0x7000000000000001) {
    if (in_RDI == 0) {
      local_4 = 0;
    }
    else if (in_RDI < 9) {
      x_00 = pow2_ceil_zu(0x275f78);
      uVar1 = lg_floor(x_00);
      if (uVar1 < 3) {
        local_3c = 0;
      }
      else {
        local_3c = uVar1 - 3;
      }
      local_4 = local_3c;
    }
    else {
      uVar1 = lg_floor(in_RDI * 2 - 1);
      if (uVar1 < 6) {
        local_40 = 0;
      }
      else {
        local_40 = uVar1 - 6;
      }
      if (uVar1 < 7) {
        local_44 = 4;
      }
      else {
        local_44 = (char)uVar1 - 3;
      }
      local_4 = local_40 * 4 + 1 +
                ((uint)((in_RDI - 1 & -1L << (local_44 & 0x3f)) >> (local_44 & 0x3f)) & 3);
    }
  }
  else {
    local_4 = 0xe8;
  }
  return local_4;
}

Assistant:

static inline szind_t
sz_size2index_compute(size_t size) {
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		return SC_NSIZES;
	}

	if (size == 0) {
		return 0;
	}
#if (SC_NTINY != 0)
	if (size <= (ZU(1) << SC_LG_TINY_MAXCLASS)) {
		szind_t lg_tmin = SC_LG_TINY_MAXCLASS - SC_NTINY + 1;
		szind_t lg_ceil = lg_floor(pow2_ceil_zu(size));
		return (lg_ceil < lg_tmin ? 0 : lg_ceil - lg_tmin);
	}
#endif
	{
		szind_t x = lg_floor((size<<1)-1);
		szind_t shift = (x < SC_LG_NGROUP + LG_QUANTUM) ? 0 :
		    x - (SC_LG_NGROUP + LG_QUANTUM);
		szind_t grp = shift << SC_LG_NGROUP;

		szind_t lg_delta = (x < SC_LG_NGROUP + LG_QUANTUM + 1)
		    ? LG_QUANTUM : x - SC_LG_NGROUP - 1;

		size_t delta_inverse_mask = ZU(-1) << lg_delta;
		szind_t mod = ((((size-1) & delta_inverse_mask) >> lg_delta)) &
		    ((ZU(1) << SC_LG_NGROUP) - 1);

		szind_t index = SC_NTINY + grp + mod;
		return index;
	}
}